

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion * quaternion_multiply(quaternion *self,quaternion *qT)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = (self->field_0).q[0];
  fVar2 = (self->field_0).q[1];
  fVar3 = (self->field_0).q[2];
  fVar4 = (self->field_0).q[3];
  fVar5 = (qT->field_0).q[0];
  fVar6 = (qT->field_0).q[1];
  fVar7 = (qT->field_0).q[2];
  fVar8 = (qT->field_0).q[3];
  (self->field_0).q[0] = -fVar3 * fVar6 + fVar7 * fVar2 + fVar4 * fVar5 + fVar8 * fVar1;
  (self->field_0).q[1] = fVar3 * fVar5 + fVar8 * fVar2 + fVar4 * fVar6 + fVar7 * -fVar1;
  (self->field_0).q[2] = fVar3 * fVar8 + fVar5 * -fVar2 + fVar4 * fVar7 + fVar6 * fVar1;
  (self->field_0).q[3] = -fVar3 * fVar7 + fVar6 * -fVar2 + fVar4 * fVar8 + fVar5 * -fVar1;
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_multiply(struct quaternion *self, const struct quaternion *qT)
{
	/* qT is the multiplicand */

	struct quaternion r;

	r.x = self->w * qT->x + self->x * qT->w + self->y * qT->z - self->z * qT->y;
	r.y = self->w * qT->y - self->x * qT->z + self->y * qT->w + self->z * qT->x;
	r.z = self->w * qT->z + self->x * qT->y - self->y * qT->x + self->z * qT->w;
	r.w = self->w * qT->w - self->x * qT->x - self->y * qT->y - self->z * qT->z;

	quaternion_set(self, &r); /* overwrite/save it */

	return self;
}